

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ast::DistExpression::DistItem>::
emplace_back<slang::ast::DistExpression::DistItem&>
          (SmallVectorBase<slang::ast::DistExpression::DistItem> *this,DistItem *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer p;
  Expression *pEVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined7 uVar7;
  pointer pDVar8;
  pointer pDVar9;
  pointer pDVar10;
  long lVar11;
  long lVar12;
  pointer __src;
  size_type sVar13;
  ulong uVar14;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    pEVar3 = args->value;
    uVar4 = *(undefined8 *)
             &(args->weight).
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
    bVar6 = (args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_engaged;
    uVar7 = *(undefined7 *)
             &(args->weight).
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11;
    (__src->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
    _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
    _M_value.expr =
         (args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
         _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
         _M_value.expr;
    (__src->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
    _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
         bVar6;
    *(undefined7 *)
     &(__src->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11 =
         uVar7;
    __src->value = pEVar3;
    *(undefined8 *)
     &(__src->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
         uVar4;
    sVar13 = this->len;
    this->len = sVar13 + 1;
    return this->data_ + sVar13;
  }
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar14 = this->len + 1;
  uVar2 = this->cap;
  if (uVar14 < uVar2 * 2) {
    uVar14 = uVar2 * 2;
  }
  if (0x3ffffffffffffff - uVar2 < uVar2) {
    uVar14 = 0x3ffffffffffffff;
  }
  lVar12 = (long)__src - (long)this->data_;
  pDVar8 = (pointer)operator_new(uVar14 << 5);
  pEVar3 = args->value;
  uVar4 = *(undefined8 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload;
  uVar5 = *(undefined8 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_engaged;
  puVar1 = (undefined8 *)((long)pDVar8 + lVar12 + 0x10);
  *puVar1 = (args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload._M_value.expr;
  puVar1[1] = uVar5;
  *(undefined8 *)((long)pDVar8 + lVar12) = pEVar3;
  ((undefined8 *)((long)pDVar8 + lVar12))[1] = uVar4;
  p = this->data_;
  sVar13 = this->len;
  lVar11 = (long)p + (sVar13 * 0x20 - (long)__src);
  pDVar9 = p;
  pDVar10 = pDVar8;
  if (lVar11 == 0) {
    pDVar9 = pDVar8;
    pDVar10 = p;
    if (sVar13 != 0) {
      do {
        pEVar3 = pDVar10->value;
        uVar4 = *(undefined8 *)
                 &(pDVar10->weight).
                  super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                  _M_payload;
        bVar6 = (pDVar10->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
        uVar7 = *(undefined7 *)
                 &(pDVar10->weight).
                  super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                  field_0x11;
        (pDVar9->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
        _M_value.expr =
             (pDVar10->weight).
             super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
             _M_value.expr;
        (pDVar9->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
             bVar6;
        *(undefined7 *)
         &(pDVar9->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
          _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11
             = uVar7;
        pDVar9->value = pEVar3;
        *(undefined8 *)
         &(pDVar9->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
          _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload
             = uVar4;
        pDVar10 = pDVar10 + 1;
        pDVar9 = pDVar9 + 1;
      } while (pDVar10 != __src);
    }
  }
  else {
    for (; pDVar9 != __src; pDVar9 = pDVar9 + 1) {
      pEVar3 = pDVar9->value;
      uVar4 = *(undefined8 *)
               &(pDVar9->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
      bVar6 = (pDVar9->weight).
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
      uVar7 = *(undefined7 *)
               &(pDVar9->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11;
      (pDVar10->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
      _M_value.expr =
           (pDVar9->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>
           ._M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
           _M_payload._M_value.expr;
      (pDVar10->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
           bVar6;
      *(undefined7 *)
       &(pDVar10->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11 =
           uVar7;
      pDVar10->value = pEVar3;
      *(undefined8 *)
       &(pDVar10->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
           uVar4;
      pDVar10 = pDVar10 + 1;
    }
    memcpy((void *)((long)pDVar8 + lVar12 + 0x20),__src,(lVar11 - 0x20U & 0xffffffffffffffe0) + 0x20
          );
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar13 = this->len;
  }
  this->len = sVar13 + 1;
  this->cap = uVar14;
  this->data_ = pDVar8;
  return (reference)((long)pDVar8 + lVar12);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }